

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O0

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  int iVar3;
  undefined8 *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar4;
  float val_2;
  int l_1;
  float sum_3;
  float *sptr_1;
  int j_5;
  int i_7;
  int z_5;
  float *outptr_4;
  Mat m_2;
  int q_6;
  float val_1;
  int sx;
  int kj;
  int sy;
  int ki;
  int sz;
  int kd;
  int area;
  float sum_2;
  int sx0;
  int j_4;
  int sy0;
  int i_6;
  int sz0;
  int z_4;
  float *outptr_3;
  Mat m_1;
  int q_5;
  int dtailpad;
  int htailpad;
  int wtailpad;
  float val;
  int l;
  float max_value_2;
  float *sptr;
  int j_3;
  int i_5;
  int z_3;
  float *outptr_2;
  Mat m;
  int q_4;
  int j_2;
  int i_4;
  int z_2;
  int gap1;
  int gap0;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outd;
  int outh;
  int outw;
  Option opt_pad;
  Mat bottom_blob_bordered;
  int iw_1;
  int ih_1;
  int id_1;
  float sum_1;
  int wk;
  int iw1_1;
  int iw0_1;
  int j_1;
  int hk;
  int ih1_1;
  int ih0_1;
  int i_3;
  int dk;
  int id1_1;
  int id0_1;
  int z_1;
  float *outptr_1;
  float *inptr_1;
  int q_3;
  int iw;
  int ih;
  int id;
  float max_value_1;
  int iw1;
  int iw0;
  int j;
  int ih1;
  int ih0;
  int i_2;
  int id1;
  int id0;
  int z;
  float *outptr;
  float *inptr;
  int q_2;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max_value;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  undefined4 in_stack_fffffffffffff810;
  int in_stack_fffffffffffff814;
  Mat *in_stack_fffffffffffff818;
  allocator_type *in_stack_fffffffffffff820;
  size_type in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff830;
  float in_stack_fffffffffffff834;
  Mat *in_stack_fffffffffffff838;
  Allocator *in_stack_fffffffffffff840;
  int local_6f8;
  float local_6f4;
  Mat local_6f0;
  Mat *local_6a8;
  int local_69c;
  int local_698;
  int local_694;
  Option *in_stack_fffffffffffff9a0;
  Mat *in_stack_fffffffffffff9a8;
  Mat *in_stack_fffffffffffff9b0;
  Pooling3D *in_stack_fffffffffffff9b8;
  int local_5f4;
  Mat local_5f0;
  float local_5a4;
  int local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  int local_588;
  float local_584;
  int local_580;
  int local_57c;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  Mat local_568;
  float *local_520;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  float local_4bc;
  int local_4b8;
  float local_4b4;
  Mat local_4b0;
  float *local_468;
  int local_45c;
  int local_458;
  int local_454;
  Mat local_450;
  float *local_408;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  int local_3a0;
  int local_39c;
  reference local_398;
  vector<int,_std::allocator<int>_> local_388;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  undefined4 local_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  ulong local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  Mat local_310;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  float local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  Mat local_288;
  float *local_240;
  Mat local_238;
  float *local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  float local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  Mat local_1b0;
  float *local_168;
  Mat local_160;
  float *local_118;
  int local_10c;
  int local_108;
  float local_104;
  Mat local_100;
  float *local_b8;
  int local_b0;
  int local_ac;
  float local_a8 [4];
  Mat local_98;
  float *local_50;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  Mat *local_20;
  long local_18;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_38 = *(int *)(in_RSI + 0x38);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  iVar3 = (int)(in_stack_fffffffffffff828 >> 0x20);
  if (*(int *)(in_RDI + 0x104) == 0) {
    if (*(int *)(in_RDI + 0x110) == 0) {
      local_28 = in_RCX;
      local_18 = in_RSI;
      ncnn::Mat::Mat(&local_310);
      local_358 = *local_28;
      uStack_350 = local_28[1];
      local_348 = local_28[2];
      uStack_340 = local_28[3];
      uStack_330 = local_28[5];
      local_328 = local_28[6];
      uStack_320 = local_28[7];
      local_338 = local_28[4] & 0xffffffffffffff;
      make_padding(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                   in_stack_fffffffffffff9a0);
      bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810))
      ;
      if (bVar1) {
        local_4 = -100;
        local_35c = 1;
      }
      else {
        local_2c = local_310.w;
        local_30 = local_310.h;
        local_34 = local_310.d;
        local_360 = (local_310.w - *(int *)(in_RDI + 0xd4)) / *(int *)(in_RDI + 0xe0) + 1;
        local_364 = (local_310.h - *(int *)(in_RDI + 0xd8)) / *(int *)(in_RDI + 0xe4) + 1;
        local_368 = (local_310.d - *(int *)(in_RDI + 0xdc)) / *(int *)(in_RDI + 0xe8) + 1;
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                          (int)(in_stack_fffffffffffff828 >> 0x20),(int)in_stack_fffffffffffff828,
                          (int)((ulong)in_stack_fffffffffffff820 >> 0x20),
                          (int)in_stack_fffffffffffff820,(size_t)in_stack_fffffffffffff818,
                          in_stack_fffffffffffff840);
        bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810
                                                ));
        if (bVar1) {
          local_4 = -100;
          local_35c = 1;
        }
        else {
          local_36c = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xdc);
          std::allocator<int>::allocator((allocator<int> *)0x94ecad);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     in_stack_fffffffffffff828,in_stack_fffffffffffff820);
          std::allocator<int>::~allocator((allocator<int> *)0x94ecd3);
          local_398 = std::vector<int,_std::allocator<int>_>::operator[](&local_388,0);
          local_39c = 0;
          local_3a0 = 0;
          local_3a4 = local_2c - *(int *)(in_RDI + 0xd4);
          local_3a8 = local_30 * local_2c - local_2c * *(int *)(in_RDI + 0xd8);
          for (local_3ac = 0; local_3ac < *(int *)(in_RDI + 0xdc); local_3ac = local_3ac + 1) {
            for (local_3b0 = 0; local_3b0 < *(int *)(in_RDI + 0xd8); local_3b0 = local_3b0 + 1) {
              for (local_3b4 = 0; local_3b4 < *(int *)(in_RDI + 0xd4); local_3b4 = local_3b4 + 1) {
                local_398[local_39c] = local_3a0;
                local_39c = local_39c + 1;
                local_3a0 = local_3a0 + 1;
              }
              local_3a0 = local_3a4 + local_3a0;
            }
            local_3a0 = local_3a8 + local_3a0;
          }
          if (*(int *)(in_RDI + 0xd0) == 0) {
            for (local_3b8 = 0; local_3b8 < local_38; local_3b8 = local_3b8 + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
              ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
              pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_450);
              ncnn::Mat::~Mat((Mat *)0x94ef0e);
              local_408 = pfVar2;
              for (local_454 = 0; local_454 < local_368; local_454 = local_454 + 1) {
                for (local_458 = 0; local_458 < local_364; local_458 = local_458 + 1) {
                  for (local_45c = 0; local_45c < local_360; local_45c = local_45c + 1) {
                    ncnn::Mat::depth(in_stack_fffffffffffff818,in_stack_fffffffffffff814);
                    pfVar2 = ncnn::Mat::row(&local_4b0,local_458 * *(int *)(in_RDI + 0xe4));
                    iVar3 = local_45c * *(int *)(in_RDI + 0xe0);
                    ncnn::Mat::~Mat((Mat *)0x94f00a);
                    local_4b4 = pfVar2[iVar3];
                    local_468 = pfVar2 + iVar3;
                    for (local_4b8 = 0; local_4b8 < local_36c; local_4b8 = local_4b8 + 1) {
                      local_4bc = local_468[local_398[local_4b8]];
                      pfVar2 = std::max<float>(&local_4b4,&local_4bc);
                      local_4b4 = *pfVar2;
                    }
                    local_408[local_45c] = local_4b4;
                  }
                  local_408 = local_408 + local_360;
                }
              }
              ncnn::Mat::~Mat((Mat *)0x94f1c4);
            }
          }
          else if (*(int *)(in_RDI + 0xd0) == 1) {
            if (*(int *)(in_RDI + 0x10c) == 0) {
              local_4c0 = 0;
              local_4c4 = 0;
              local_4c8 = 0;
              if (*(int *)(in_RDI + 0x108) == 0) {
                local_4c0 = ((local_310.w - *(int *)(local_18 + 0x2c)) - *(int *)(in_RDI + 0xec)) -
                            *(int *)(in_RDI + 0xf0);
                local_4c4 = ((local_310.h - *(int *)(local_18 + 0x30)) - *(int *)(in_RDI + 0xf4)) -
                            *(int *)(in_RDI + 0xf8);
                local_4c8 = ((local_310.d - *(int *)(local_18 + 0x34)) - *(int *)(in_RDI + 0xfc)) -
                            *(int *)(in_RDI + 0x100);
              }
              for (local_4cc = 0; local_4cc < local_38; local_4cc = local_4cc + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
                ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
                pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_568);
                ncnn::Mat::~Mat((Mat *)0x94f340);
                local_520 = pfVar2;
                for (local_56c = 0; local_56c < local_368; local_56c = local_56c + 1) {
                  local_570 = local_56c * *(int *)(in_RDI + 0xe8);
                  for (local_574 = 0; local_574 < local_364; local_574 = local_574 + 1) {
                    local_578 = local_574 * *(int *)(in_RDI + 0xe4);
                    for (local_57c = 0; local_57c < local_360; local_57c = local_57c + 1) {
                      local_580 = local_57c * *(int *)(in_RDI + 0xe0);
                      local_584 = 0.0;
                      local_588 = 0;
                      for (local_58c = 0; local_58c < *(int *)(in_RDI + 0xdc);
                          local_58c = local_58c + 1) {
                        local_590 = local_570 + local_58c;
                        if (*(int *)(in_RDI + 0xfc) <= local_590) {
                          if ((local_34 - *(int *)(in_RDI + 0x100)) - local_4c8 <= local_590) break;
                          for (local_594 = 0; local_594 < *(int *)(in_RDI + 0xd8);
                              local_594 = local_594 + 1) {
                            local_598 = local_578 + local_594;
                            if (*(int *)(in_RDI + 0xf4) <= local_598) {
                              if ((local_30 - *(int *)(in_RDI + 0xf8)) - local_4c4 <= local_598)
                              break;
                              for (local_59c = 0; local_59c < *(int *)(in_RDI + 0xd4);
                                  local_59c = local_59c + 1) {
                                local_5a0 = local_580 + local_59c;
                                if (*(int *)(in_RDI + 0xec) <= local_5a0) {
                                  if ((local_2c - *(int *)(in_RDI + 0xf0)) - local_4c0 <= local_5a0)
                                  break;
                                  ncnn::Mat::depth(in_stack_fffffffffffff818,
                                                   in_stack_fffffffffffff814);
                                  in_stack_fffffffffffff838 =
                                       (Mat *)ncnn::Mat::row(&local_5f0,local_598);
                                  in_stack_fffffffffffff834 =
                                       *(float *)((long)&in_stack_fffffffffffff838->data +
                                                 (long)local_5a0 * 4);
                                  ncnn::Mat::~Mat((Mat *)0x94f63e);
                                  local_584 = in_stack_fffffffffffff834 + local_584;
                                  local_588 = local_588 + 1;
                                  local_5a4 = in_stack_fffffffffffff834;
                                }
                              }
                            }
                          }
                        }
                      }
                      local_520[local_57c] = local_584 / (float)local_588;
                    }
                    local_520 = local_520 + local_360;
                  }
                }
                ncnn::Mat::~Mat((Mat *)0x94f782);
              }
            }
            else {
              for (local_5f4 = 0; local_5f4 < local_38; local_5f4 = local_5f4 + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
                ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
                pfVar2 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffff970);
                ncnn::Mat::~Mat((Mat *)0x94f82b);
                for (local_694 = 0; local_694 < local_368; local_694 = local_694 + 1) {
                  for (local_698 = 0; local_698 < local_364; local_698 = local_698 + 1) {
                    for (local_69c = 0; local_69c < local_360; local_69c = local_69c + 1) {
                      ncnn::Mat::depth(in_stack_fffffffffffff818,in_stack_fffffffffffff814);
                      in_stack_fffffffffffff820 =
                           (allocator_type *)
                           ncnn::Mat::row(&local_6f0,local_698 * *(int *)(in_RDI + 0xe4));
                      in_stack_fffffffffffff818 =
                           (Mat *)(in_stack_fffffffffffff820 +
                                  (long)(local_69c * *(int *)(in_RDI + 0xe0)) * 4);
                      ncnn::Mat::~Mat((Mat *)0x94f927);
                      local_6f4 = 0.0;
                      for (local_6f8 = 0; local_6f8 < local_36c; local_6f8 = local_6f8 + 1) {
                        local_6f4 = *(float *)((long)&in_stack_fffffffffffff818->data +
                                              (long)local_398[local_6f8] * 4) + local_6f4;
                      }
                      pfVar2[local_69c] = local_6f4 / (float)local_36c;
                      local_6a8 = in_stack_fffffffffffff818;
                    }
                    pfVar2 = pfVar2 + local_360;
                  }
                }
                ncnn::Mat::~Mat((Mat *)0x94fab9);
              }
            }
          }
          local_4 = 0;
          local_35c = 1;
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff820);
        }
      }
      ncnn::Mat::~Mat((Mat *)0x94fb25);
    }
    else {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),iVar3,
                        (int)in_stack_fffffffffffff828,
                        (int)((ulong)in_stack_fffffffffffff820 >> 0x20),
                        (int)in_stack_fffffffffffff820,(size_t)in_stack_fffffffffffff818,
                        in_stack_fffffffffffff840);
      bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810))
      ;
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (*(int *)(in_RDI + 0xd0) == 0) {
          for (local_10c = 0; local_10c < local_38; local_10c = local_10c + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
            pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_160);
            ncnn::Mat::~Mat((Mat *)0x94e1d7);
            local_118 = pfVar2;
            ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
            pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_1b0);
            ncnn::Mat::~Mat((Mat *)0x94e22f);
            local_168 = pfVar2;
            for (local_1b4 = 0; local_1b4 < *(int *)(in_RDI + 0x11c); local_1b4 = local_1b4 + 1) {
              local_1b8 = (local_34 * local_1b4) / *(int *)(in_RDI + 0x11c);
              local_1bc = (local_34 * (local_1b4 + 1) + *(int *)(in_RDI + 0x11c) + -1) /
                          *(int *)(in_RDI + 0x11c);
              for (local_1c0 = 0; local_1c0 < *(int *)(in_RDI + 0x118); local_1c0 = local_1c0 + 1) {
                local_1c4 = (local_30 * local_1c0) / *(int *)(in_RDI + 0x118);
                local_1c8 = (local_30 * (local_1c0 + 1) + *(int *)(in_RDI + 0x118) + -1) /
                            *(int *)(in_RDI + 0x118);
                for (local_1cc = 0; local_1cc < *(int *)(in_RDI + 0x114); local_1cc = local_1cc + 1)
                {
                  local_1d0 = (local_2c * local_1cc) / *(int *)(in_RDI + 0x114);
                  local_1d4 = (local_2c * (local_1cc + 1) + *(int *)(in_RDI + 0x114) + -1) /
                              *(int *)(in_RDI + 0x114);
                  local_1d8 = local_118[local_1b8 * local_2c * local_30 + local_1c4 * local_2c +
                                        local_1d0];
                  for (local_1dc = local_1b8; local_1dc < local_1bc; local_1dc = local_1dc + 1) {
                    for (local_1e0 = local_1c4; local_1e0 < local_1c8; local_1e0 = local_1e0 + 1) {
                      for (local_1e4 = local_1d0; local_1e4 < local_1d4; local_1e4 = local_1e4 + 1)
                      {
                        pfVar2 = std::max<float>(&local_1d8,
                                                 local_118 +
                                                 (local_1dc * local_2c * local_30 +
                                                  local_1e0 * local_2c + local_1e4));
                        local_1d8 = *pfVar2;
                      }
                    }
                  }
                  local_168[local_1cc] = local_1d8;
                }
                local_168 = local_168 + *(int *)(in_RDI + 0x114);
              }
            }
          }
        }
        else if (*(int *)(in_RDI + 0xd0) == 1) {
          for (local_1e8 = 0; local_1e8 < local_38; local_1e8 = local_1e8 + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
            pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_238);
            ncnn::Mat::~Mat((Mat *)0x94e65e);
            local_1f0 = pfVar2;
            ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
            pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_288);
            ncnn::Mat::~Mat((Mat *)0x94e6b6);
            local_240 = pfVar2;
            for (local_28c = 0; local_28c < *(int *)(in_RDI + 0x11c); local_28c = local_28c + 1) {
              local_290 = (local_34 * local_28c) / *(int *)(in_RDI + 0x11c);
              local_294 = (local_34 * (local_28c + 1) + *(int *)(in_RDI + 0x11c) + -1) /
                          *(int *)(in_RDI + 0x11c);
              local_298 = local_294 - local_290;
              for (local_29c = 0; local_29c < *(int *)(in_RDI + 0x118); local_29c = local_29c + 1) {
                local_2a0 = (local_30 * local_29c) / *(int *)(in_RDI + 0x118);
                local_2a4 = (local_30 * (local_29c + 1) + *(int *)(in_RDI + 0x118) + -1) /
                            *(int *)(in_RDI + 0x118);
                local_2a8 = local_2a4 - local_2a0;
                for (local_2ac = 0; local_2ac < *(int *)(in_RDI + 0x114); local_2ac = local_2ac + 1)
                {
                  local_2b0 = (local_2c * local_2ac) / *(int *)(in_RDI + 0x114);
                  local_2b4 = (local_2c * (local_2ac + 1) + *(int *)(in_RDI + 0x114) + -1) /
                              *(int *)(in_RDI + 0x114);
                  local_2b8 = local_2b4 - local_2b0;
                  local_2bc = 0.0;
                  for (local_2c0 = local_290; iVar3 = local_2a0, local_2c0 < local_294;
                      local_2c0 = local_2c0 + 1) {
                    while (local_2c4 = iVar3, iVar3 = local_2b0, local_2c4 < local_2a4) {
                      while (local_2c8 = iVar3, local_2c8 < local_2b4) {
                        local_2bc = local_1f0[local_2c0 * local_2c * local_30 + local_2c4 * local_2c
                                              + local_2c8] + local_2bc;
                        iVar3 = local_2c8 + 1;
                      }
                      iVar3 = local_2c4 + 1;
                    }
                  }
                  local_240[local_2ac] =
                       ((local_2bc / (float)local_2a8) / (float)local_2b8) / (float)local_298;
                }
                local_240 = local_240 + *(int *)(in_RDI + 0x114);
              }
            }
          }
        }
        local_4 = 0;
      }
    }
  }
  else {
    local_20 = in_RDX;
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),iVar3,
                      (size_t)in_stack_fffffffffffff820,(Allocator *)in_stack_fffffffffffff818);
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_44 = local_2c * local_30 * local_34;
      if (*(int *)(in_RDI + 0xd0) == 0) {
        for (local_48 = 0; local_48 < local_38; local_48 = local_48 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_98);
          ncnn::Mat::~Mat((Mat *)0x94de65);
          local_a8[0] = *pfVar2;
          local_50 = pfVar2;
          for (local_ac = 0; fVar4 = local_a8[0], local_ac < local_44; local_ac = local_ac + 1) {
            pfVar2 = std::max<float>(local_a8,local_50 + local_ac);
            local_a8[0] = *pfVar2;
          }
          pfVar2 = ncnn::Mat::operator[](local_20,(long)local_48);
          *pfVar2 = fVar4;
        }
      }
      else if (*(int *)(in_RDI + 0xd0) == 1) {
        for (local_b0 = 0; local_b0 < local_38; local_b0 = local_b0 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff838,(int)in_stack_fffffffffffff834);
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_100);
          ncnn::Mat::~Mat((Mat *)0x94dfda);
          local_104 = 0.0;
          for (local_108 = 0; local_108 < local_44; local_108 = local_108 + 1) {
            local_104 = pfVar2[local_108] + local_104;
          }
          fVar4 = local_104 / (float)local_44;
          local_b8 = pfVar2;
          pfVar2 = ncnn::Mat::operator[](local_20,(long)local_b0);
          *pfVar2 = fVar4;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}